

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

int phred_sum(string *phred,char phred_base)

{
  ulong uVar1;
  char *pcVar2;
  char in_SIL;
  ulong in_RDI;
  size_t i;
  int result;
  undefined8 local_18;
  undefined4 local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_18) break;
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    local_10 = ((int)*pcVar2 - (int)in_SIL) + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

int phred_sum(const string& phred, char phred_base=33) {
    int result = 0;
    for (size_t i=0; i<phred.size(); ++i) {
        result += phred[i] - phred_base;
    }
    return result;
}